

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

cl_kernel xmrig::OclLib::createKernel(cl_program program,char *kernel_name,cl_int *errcode_ret)

{
  cl_kernel p_Var1;
  char *pcVar2;
  char *pcVar3;
  
  p_Var1 = (*pCreateKernel)(program,kernel_name,errcode_ret);
  if (*errcode_ret != 0) {
    pcVar2 = ocl_tag();
    pcVar3 = OclError::toString(*errcode_ret);
    p_Var1 = (cl_kernel)0x0;
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31mclCreateKernel\x1b[0m\x1b[0;31m for kernel \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar2,pcVar3,kernel_name);
  }
  return p_Var1;
}

Assistant:

cl_kernel xmrig::OclLib::createKernel(cl_program program, const char *kernel_name, cl_int *errcode_ret) noexcept
{
    assert(pCreateKernel != nullptr);

    auto result = pCreateKernel(program, kernel_name, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("clCreateKernel") RED(" for kernel ") RED_BOLD("%s"),
                ocl_tag(), OclError::toString(*errcode_ret), kernel_name);

        return nullptr;
    }

    return result;
}